

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O3

void __thiscall r_exec::Group::delete_view(Group *this,View *v)

{
  _Object *p_Var1;
  undefined1 uVar2;
  int iVar3;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var4;
  
  iVar3 = (*(v->super_View).super__Object._vptr__Object[2])(v);
  if ((char)iVar3 == '\0') {
    p_Var1 = (v->super_View).object.object;
    (*p_Var1->_vptr__Object[4])(p_Var1,0);
    uVar2 = r_code::Atom::getDescriptor();
    switch(uVar2) {
    case 0xc3:
    case 0xc4:
      p_Var4 = &(this->other_views)._M_h;
      break;
    default:
      goto switchD_00171a2d_caseD_c5;
    case 200:
      p_Var4 = &(this->group_views)._M_h;
      break;
    case 0xc9:
    case 0xca:
    case 0xcd:
    case 0xce:
    case 0xcf:
      p_Var4 = &(this->ipgm_views)._M_h;
      break;
    case 0xcb:
      p_Var4 = &(this->input_less_ipgm_views)._M_h;
      break;
    case 0xcc:
      p_Var4 = &(this->anti_ipgm_views)._M_h;
    }
  }
  else {
    p_Var4 = &(this->notification_views)._M_h;
  }
  r_exec::View::get_oid(v);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(p_Var4);
switchD_00171a2d_caseD_c5:
  return;
}

Assistant:

void Group::delete_view(View *v)
{
    if (v->isNotification()) {
        notification_views.erase(v->get_oid());
    } else switch (v->object->code(0).getDescriptor()) {
        case Atom::NULL_PROGRAM:
        case Atom::INSTANTIATED_PROGRAM:
        case Atom::INSTANTIATED_CPP_PROGRAM:
        case Atom::COMPOSITE_STATE:
        case Atom::MODEL:
            ipgm_views.erase(v->get_oid());
            break;

        case Atom::INSTANTIATED_ANTI_PROGRAM:
            anti_ipgm_views.erase(v->get_oid());
            break;

        case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
            input_less_ipgm_views.erase(v->get_oid());
            break;

        case Atom::OBJECT:
        case Atom::MARKER:
            other_views.erase(v->get_oid());
            break;

        case Atom::GROUP:
            group_views.erase(v->get_oid());
            break;
        }
}